

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

_Bool mips_cpu_has_work(CPUState *cs)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  
  uVar1 = cs->interrupt_request;
  if ((uVar1 & 2) != 0) {
    uVar4 = *(uint *)((long)cs[1].tb_jmp_cache + 0x10a4);
    uVar6 = *(uint *)((long)cs[1].tb_jmp_cache + 0x10b4);
    uVar7 = uVar4 & 0xff00;
    bVar2 = (uVar7 & uVar6) != 0;
    if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x10ec) & 0x40) != 0) {
      bVar2 = uVar7 < (uVar6 & 0xff00);
    }
    if ((bVar2) &&
       (((((uVar4 & 7) == 1 && ((*(byte *)((long)cs[1].tb_jmp_cache + 0x485c) & 4) == 0)) &&
         ((*(byte *)((long)cs[1].tb_jmp_cache + 0xb89) & 4) == 0)) ||
        ((*(byte *)((long)cs[1].tb_jmp_cache + 0x4881) & 0x20) != 0)))) {
      bVar3 = 1;
      goto LAB_0095097b;
    }
  }
  bVar3 = 0;
LAB_0095097b:
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x10ec) & 4) != 0) {
    bVar5 = 1;
    if ((uVar1 >> 8 & 1) == 0) {
      bVar5 = bVar3;
    }
    uVar4 = (uint)cs[1].tb_jmp_cache[0x912]->pc & 1;
    uVar6 = *(uint *)((long)cs[1].tb_jmp_cache + 0xf9c) & 1;
    bVar3 = (byte)uVar4;
    if (uVar4 != 0) {
      bVar3 = bVar5;
    }
    if (uVar6 == 0) {
      bVar3 = (byte)uVar6;
    }
    if ((*(uint *)(cs[1].tb_jmp_cache + 0x171) >> 0xd & 1) == 0) {
      bVar3 = 0;
    }
    if (((ulong)cs[1].tb_jmp_cache[0x172] & 1) != 0) {
      bVar3 = 0;
    }
  }
  return (_Bool)((byte)(uVar1 >> 8) & *(byte *)(cs[1].tb_jmp_cache + 0x21f) >> 7 | bVar3);
}

Assistant:

static bool mips_cpu_has_work(CPUState *cs)
{
    MIPSCPU *cpu = MIPS_CPU(cs);
    CPUMIPSState *env = &cpu->env;
    bool has_work = false;

    /*
     * Prior to MIPS Release 6 it is implementation dependent if non-enabled
     * interrupts wake-up the CPU, however most of the implementations only
     * check for interrupts that can be taken.
     */
    if ((cs->interrupt_request & CPU_INTERRUPT_HARD) &&
        cpu_mips_hw_interrupts_pending(env)) {
        if (cpu_mips_hw_interrupts_enabled(env) ||
            (env->insn_flags & ISA_MIPS32R6)) {
            has_work = true;
        }
    }

    /* MIPS-MT has the ability to halt the CPU.  */
    if (env->CP0_Config3 & (1 << CP0C3_MT)) {
        /*
         * The QEMU model will issue an _WAKE request whenever the CPUs
         * should be woken up.
         */
        if (cs->interrupt_request & CPU_INTERRUPT_WAKE) {
            has_work = true;
        }

        if (!mips_vpe_active(env)) {
            has_work = false;
        }
    }

    /* MIPS Release 6 has the ability to halt the CPU.  */
    if (env->CP0_Config5 & (1 << CP0C5_VP)) {
        if (cs->interrupt_request & CPU_INTERRUPT_WAKE) {
            has_work = true;
        }
        if (!mips_vp_active(env, cs)) {
            has_work = false;
        }
    }

    return has_work;
}